

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qgraphicsscenebsptreeindex_p.cpp
# Opt level: O0

void QGraphicsSceneBspTreeIndex::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  int *piVar1;
  int iVar2;
  undefined8 *in_RCX;
  int in_EDX;
  int in_ESI;
  long *in_RDI;
  void *_v_1;
  void *_v;
  QGraphicsSceneBspTreeIndex *_t;
  int in_stack_ffffffffffffffcc;
  QGraphicsSceneBspTreeIndex *in_stack_ffffffffffffffd0;
  
  if (in_ESI == 0) {
    in_stack_ffffffffffffffcc = in_EDX;
    if (in_EDX == 0) {
      (**(code **)(*in_RDI + 0xa0))(in_RDI,in_RCX[1]);
    }
    else if (in_EDX == 1) {
      d_func((QGraphicsSceneBspTreeIndex *)0xa1fe82);
      QGraphicsSceneBspTreeIndexPrivate::_q_updateSortCache((QGraphicsSceneBspTreeIndexPrivate *)_v)
      ;
    }
    else if (in_EDX == 2) {
      d_func((QGraphicsSceneBspTreeIndex *)0xa1fe96);
      QGraphicsSceneBspTreeIndexPrivate::_q_updateIndex((QGraphicsSceneBspTreeIndexPrivate *)_o);
    }
  }
  if ((in_ESI == 1) && (piVar1 = (int *)*in_RCX, in_EDX == 0)) {
    iVar2 = bspTreeDepth(in_stack_ffffffffffffffd0);
    *piVar1 = iVar2;
  }
  if ((in_ESI == 2) && (in_EDX == 0)) {
    setBspTreeDepth((QGraphicsSceneBspTreeIndex *)*in_RCX,in_stack_ffffffffffffffcc);
  }
  return;
}

Assistant:

void QGraphicsSceneBspTreeIndex::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QGraphicsSceneBspTreeIndex *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->updateSceneRect((*reinterpret_cast< std::add_pointer_t<QRectF>>(_a[1]))); break;
        case 1: _t->d_func()->_q_updateSortCache(); break;
        case 2: _t->d_func()->_q_updateIndex(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<int*>(_v) = _t->bspTreeDepth(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setBspTreeDepth(*reinterpret_cast<int*>(_v)); break;
        default: break;
        }
    }
}